

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_init(nk_draw_list *list)

{
  nk_vec2 nVar1;
  long lVar2;
  float fVar3;
  
  if (list != (nk_draw_list *)0x0) {
    nk_zero(list,0xf0);
    for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 1) {
      fVar3 = ((float)lVar2 / 12.0 + (float)lVar2 / 12.0) * 3.1415927;
      nVar1.y = ((((((fVar3 * 0.00013823564 + -0.0030399605) * fVar3 + 0.02080266) * fVar3 +
                   -0.02673534) * fVar3 + -0.13807878) * fVar3 + -0.012127613) * fVar3 + 1.0008676)
                * fVar3 + 1.910593e-31;
      nVar1.x = ((((((fVar3 * -5.2302214e-14 + 0.000990141) * fVar3 + -0.018663716) * fVar3 +
                   0.1071238) * fVar3 + -0.11813404) * fVar3 + -0.39438233) * fVar3 + -0.038191997)
                * fVar3 + 1.002386;
      list->circle_vtx[lVar2] = nVar1;
    }
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1e56,"void nk_draw_list_init(struct nk_draw_list *)");
}

Assistant:

NK_API void
nk_draw_list_init(struct nk_draw_list *list)
{
    nk_size i = 0;
    NK_ASSERT(list);
    if (!list) return;
    nk_zero(list, sizeof(*list));
    for (i = 0; i < NK_LEN(list->circle_vtx); ++i) {
        const float a = ((float)i / (float)NK_LEN(list->circle_vtx)) * 2 * NK_PI;
        list->circle_vtx[i].x = (float)NK_COS(a);
        list->circle_vtx[i].y = (float)NK_SIN(a);
    }
}